

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_literals.cpp
# Opt level: O2

spv_result_t spvtools::val::LiteralsPass(ValidationState_t *_,Instruction *inst)

{
  uint uVar1;
  pointer psVar2;
  sbyte sVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  DiagnosticStream DStack_1e8;
  
  psVar2 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(inst->operands_).
                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4;
  do {
    bVar6 = lVar5 == 0;
    lVar5 = lVar5 + -1;
    if (bVar6) {
      return SPV_SUCCESS;
    }
    if ((psVar2->number_kind - SPV_NUMBER_UNSIGNED_INT < 3) &&
       (uVar4 = psVar2->number_bit_width & 0x1f, uVar4 != 0)) {
      uVar1 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start
              [(ulong)psVar2->offset + ((ulong)psVar2->num_words - 1)];
      sVar3 = (sbyte)uVar4;
      uVar4 = -1 << sVar3;
      if (psVar2->number_kind == SPV_NUMBER_SIGNED_INT) {
        bVar6 = uVar4 <= uVar1;
        if ((uVar1 >> ((byte)(sVar3 - 1) & 0x1f) & 1) == 0) {
          bVar6 = (uVar4 & uVar1) == 0;
        }
        if (!bVar6) {
LAB_00179301:
          ValidationState_t::diag(&DStack_1e8,_,SPV_ERROR_INVALID_VALUE,inst);
          std::operator<<((ostream *)&DStack_1e8,
                          "The high-order bits of a literal number in instruction <id> ");
          std::ostream::_M_insert<unsigned_long>((ulong)&DStack_1e8);
          std::operator<<((ostream *)&DStack_1e8," must be 0 for a floating-point type, ");
          std::operator<<((ostream *)&DStack_1e8,"or 0 for an integer type with Signedness of 0, ");
          std::operator<<((ostream *)&DStack_1e8,"or sign extended when Signedness is 1");
          DiagnosticStream::~DiagnosticStream(&DStack_1e8);
          return DStack_1e8.error_;
        }
      }
      else if ((uVar4 & uVar1) != 0) goto LAB_00179301;
    }
    psVar2 = psVar2 + 1;
  } while( true );
}

Assistant:

spv_result_t LiteralsPass(ValidationState_t& _, const Instruction* inst) {
  // For every operand that is a literal number
  for (size_t i = 0; i < inst->operands().size(); i++) {
    const spv_parsed_operand_t& operand = inst->operand(i);
    if (!IsLiteralNumber(operand)) continue;

    // The upper bits are always in the last word (little-endian)
    int last_index = operand.offset + operand.num_words - 1;
    const uint32_t upper_word = inst->word(last_index);

    // TODO(jcaraban): is the |word size| defined in some header?
    const uint32_t word_size = 32;
    uint32_t bit_width = operand.number_bit_width;

    // Bit widths that are a multiple of the word size have no upper bits
    const auto remaining_value_bits = bit_width % word_size;
    if (remaining_value_bits == 0) continue;

    const bool signedness = operand.number_kind == SPV_NUMBER_SIGNED_INT;

    if (!VerifyUpperBits(upper_word, remaining_value_bits, signedness)) {
      return _.diag(SPV_ERROR_INVALID_VALUE, inst)
             << "The high-order bits of a literal number in instruction <id> "
             << inst->id() << " must be 0 for a floating-point type, "
             << "or 0 for an integer type with Signedness of 0, "
             << "or sign extended when Signedness is 1";
    }
  }
  return SPV_SUCCESS;
}